

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_world.cc
# Opt level: O2

void sptk::world::cftrec4(int n,double *a,int nw,double *w)

{
  int isplt;
  uint n_00;
  uint n_01;
  int k;
  int j;
  
  n_00 = n;
  while (0x200 < (int)n_00) {
    n_01 = n_00 >> 2;
    cftmdl1(n_01,a + (int)(n - n_01),w + (int)(nw - (n_00 >> 3)));
    n_00 = n_01;
  }
  j = n - n_00;
  k = 1;
  isplt = 1;
  while( true ) {
    cftleaf(n_00,isplt,a + j,nw,w);
    if (j < 1) break;
    isplt = cfttree(n_00,j,k,a,nw,w);
    j = j - n_00;
    k = k + 1;
  }
  return;
}

Assistant:

void cftrec4(int n, double *a, int nw, double *w) {
#if 0
  int cfttree(int n, int j, int k, double *a, int nw, double *w);
  void cftleaf(int n, int isplt, double *a, int nw, double *w);
  void cftmdl1(int n, double *a, double *w);
#endif
  int isplt, j, k, m;

  m = n;
  while (m > 512) {
    m >>= 2;
    cftmdl1(m, &a[n - m], &w[nw - (m >> 1)]);
  }
  cftleaf(m, 1, &a[n - m], nw, w);
  k = 0;
  for (j = n - m; j > 0; j -= m) {
    k++;
    isplt = cfttree(m, j, k, a, nw, w);
    cftleaf(m, isplt, &a[j - m], nw, w);
  }
}